

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

void __thiscall mpt::layout::graph::transform3::transform3(transform3 *this)

{
  data *local_28;
  transform3 *this_local;
  
  reference<mpt::transform>::type::type(&this->super_type,1);
  (this->super_type).super_transform._vptr_transform = (_func_int **)&PTR_dimensions_0017cf30;
  local_28 = this->_dim;
  do {
    data::data(local_28,-1);
    local_28 = local_28 + 1;
  } while (local_28 != (data *)&this->_base);
  fpoint::fpoint(&this->_base,0.0,0.0);
  data::data(this->_dim,1);
  data::data(this->_dim + 1,2);
  data::data(this->_dim + 2,3);
  return;
}

Assistant:

layout::graph::transform3::transform3()
{
	new (&_dim[0]) data(AxisStyleX);
	new (&_dim[1]) data(AxisStyleY);
	new (&_dim[2]) data(AxisStyleZ);
}